

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *pLatch)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pLatch_local;
  
  iVar1 = Abc_ObjIsLatch(pLatch);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsLatch(pLatch)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                  ,0x4a,"int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *)");
  }
  pAVar2 = Abc_ObjFanin0(pLatch);
  pAVar2 = Abc_ObjFanin0(pAVar2);
  iVar1 = Abc_ObjIsBo(pAVar2);
  if (iVar1 != 0) {
    pObj = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      pAVar2 = Abc_ObjFanin0(pAVar2);
      iVar1 = Abc_NtkLatchIsSelfFeed_rec(pAVar2,pLatch);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int Abc_NtkLatchIsSelfFeed( Abc_Obj_t * pLatch )
{
    Abc_Obj_t * pFanin;
    assert( Abc_ObjIsLatch(pLatch) );
    pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
    if ( !Abc_ObjIsBo(pFanin) || !Abc_ObjIsLatch(Abc_ObjFanin0(pFanin)) )
        return 0;
    return Abc_NtkLatchIsSelfFeed_rec( Abc_ObjFanin0(pFanin), pLatch );
}